

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall TC_parser<false>::nameSpaceInfo(TC_parser<false> *this)

{
  size_t sVar1;
  uint64_t uVar2;
  TC_parser<false> *in_RDI;
  substring sVar3;
  substring name;
  char *in_stack_000000a0;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  TC_parser<false> *in_stack_000000c0;
  
  if ((((in_RDI->reading_head == in_RDI->endLine) || (*in_RDI->reading_head == '|')) ||
      (*in_RDI->reading_head == ' ')) ||
     (((*in_RDI->reading_head == '\t' || (*in_RDI->reading_head == ':')) ||
      (*in_RDI->reading_head == '\r')))) {
    parserWarning(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                  in_stack_000000a0);
  }
  else {
    in_RDI->index = *in_RDI->reading_head;
    if ((in_RDI->redefine_some & 1U) != 0) {
      in_RDI->index = (*in_RDI->redefine)[in_RDI->index];
    }
    sVar1 = features::size((features *)0x3e891a);
    if (sVar1 == 0) {
      in_RDI->new_index = true;
    }
    sVar3 = read_name(in_RDI);
    uVar2 = (*in_RDI->p->hasher)(sVar3,(ulong)in_RDI->hash_seed);
    in_RDI->channel_hash = uVar2;
    nameSpaceInfoValue(in_RDI);
  }
  return;
}

Assistant:

inline void nameSpaceInfo()
  {
    if (reading_head == endLine || *reading_head == '|' || *reading_head == ' ' || *reading_head == '\t' ||
        *reading_head == ':' || *reading_head == '\r')
    {
      // syntax error
      parserWarning("malformed example! String expected after : \"", beginLine, reading_head, "\"");
    }
    else
    {
      // NameSpaceInfo --> 'String' NameSpaceInfoValue
      index = (unsigned char)(*reading_head);
      if (redefine_some)
        index = (*redefine)[index];  // redefine index
      if (ae->feature_space[index].size() == 0)
        new_index = true;
      substring name = read_name();
      if (audit)
      {
        v_array<char> base_v_array = v_init<char>();
        push_many(base_v_array, name.begin, name.end - name.begin);
        base_v_array.push_back('\0');
        if (base != nullptr)
          free(base);
        base = base_v_array.begin();
      }
      channel_hash = p->hasher(name, this->hash_seed);
      nameSpaceInfoValue();
    }
  }